

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

void Abc_NtkDontCareTruthOne(Odc_Man_t *p,Odc_Lit_t Lit)

{
  ushort uVar1;
  uint uVar2;
  Odc_Obj_t *pOVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  
  if ((Lit & 1) != 0) {
    __assert_fail("!Odc_IsComplement( Lit )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x395,"void Abc_NtkDontCareTruthOne(Odc_Man_t *, Odc_Lit_t)");
  }
  if (p->nPis < (int)(uint)(Lit >> 1)) {
    pOVar3 = Odc_Lit2Obj(p,Lit);
    puVar4 = Odc_ObjTruth(p,Lit);
    puVar5 = Odc_ObjTruth(p,pOVar3->iFan0 & 0xfffe);
    puVar6 = Odc_ObjTruth(p,pOVar3->iFan1 & 0xfffe);
    uVar2._0_2_ = pOVar3->iFan0;
    uVar2._2_2_ = pOVar3->iFan1;
    uVar1 = pOVar3->iFan1;
    if ((uVar1 & uVar2 & 1) == 0) {
      if ((uVar2 & 1) == 0 || (uVar1 & 1) != 0) {
        if (((uVar2 & 1) == 0 & (byte)uVar1) == 0) {
          for (lVar7 = 0; lVar7 < p->nWords; lVar7 = lVar7 + 1) {
            puVar4[lVar7] = puVar6[lVar7] & puVar5[lVar7];
          }
        }
        else {
          for (lVar7 = 0; lVar7 < p->nWords; lVar7 = lVar7 + 1) {
            puVar4[lVar7] = ~puVar6[lVar7] & puVar5[lVar7];
          }
        }
      }
      else {
        for (lVar7 = 0; lVar7 < p->nWords; lVar7 = lVar7 + 1) {
          puVar4[lVar7] = ~puVar5[lVar7] & puVar6[lVar7];
        }
      }
    }
    else {
      for (lVar7 = 0; lVar7 < p->nWords; lVar7 = lVar7 + 1) {
        puVar4[lVar7] = ~(puVar6[lVar7] | puVar5[lVar7]);
      }
    }
    return;
  }
  __assert_fail("!Odc_IsTerm( p, Lit )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                ,0x396,"void Abc_NtkDontCareTruthOne(Odc_Man_t *, Odc_Lit_t)");
}

Assistant:

void Abc_NtkDontCareTruthOne( Odc_Man_t * p, Odc_Lit_t Lit )
{
    Odc_Obj_t * pObj;
    unsigned * pInfo, * pInfo1, * pInfo2;
    int k, fComp1, fComp2;
    assert( !Odc_IsComplement( Lit ) );
    assert( !Odc_IsTerm( p, Lit ) );
    // get the truth tables
    pObj   = Odc_Lit2Obj( p, Lit );
    pInfo  = Odc_ObjTruth( p, Lit );
    pInfo1 = Odc_ObjTruth( p, Odc_ObjFanin0(pObj) );
    pInfo2 = Odc_ObjTruth( p, Odc_ObjFanin1(pObj) );
    fComp1 = Odc_ObjFaninC0( pObj );
    fComp2 = Odc_ObjFaninC1( pObj );
    // simulate
    if ( fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] = ~pInfo1[k] & ~pInfo2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] = ~pInfo1[k] &  pInfo2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] =  pInfo1[k] & ~pInfo2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] =  pInfo1[k] &  pInfo2[k];
}